

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O2

void gba_handle_event(SDL_Event *event)

{
  Uint32 UVar1;
  uint32_t uVar2;
  
  UVar1 = event->type;
  switch(UVar1) {
  case 0x650:
    update_joyaxis((event->display).event,(event->jaxis).value);
    return;
  case 0x651:
    update_joybutton((event->display).event,true);
    return;
  case 0x652:
    update_joybutton((event->display).event,false);
    return;
  case 0x653:
  case 0x654:
  case 0x655:
    gba_refresh_gamepads();
    return;
  }
  if (UVar1 == 0x100) {
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  User requested quit\n\x1b[0;m");
    }
    should_quit = true;
  }
  else {
    if (UVar1 == 0x300) {
      uVar2 = (event->display).display;
      if (uVar2 == window_id) {
        if ((event->window).data2 == 0x6f) {
          set_dbg_window_visibility(true);
          return;
        }
        update_key((event->window).data2,true);
        return;
      }
    }
    else {
      if (UVar1 != 0x301) {
        return;
      }
      uVar2 = (event->display).display;
    }
    if (uVar2 == window_id) {
      update_key((event->window).data2,false);
      return;
    }
  }
  return;
}

Assistant:

void gba_handle_event(SDL_Event* event) {
    switch (event->type) {
        case SDL_QUIT:
            logwarn("User requested quit")
            should_quit = true;
            break;
        case SDL_KEYDOWN:
            if (event->key.windowID == window_id) {
                if (event->key.keysym.sym == SDLK_o) {
                    set_dbg_window_visibility(true);
                } else {
                    update_key(event->key.keysym.sym, true);
                }
                break;
            }
        case SDL_KEYUP:
            if (event->key.windowID == window_id) {
                update_key(event->key.keysym.sym, false);
            }
            break;
        case SDL_CONTROLLERDEVICEADDED:
        case SDL_CONTROLLERDEVICEREMOVED:
        case SDL_CONTROLLERDEVICEREMAPPED:
            gba_refresh_gamepads();
            break;
        case SDL_CONTROLLERBUTTONDOWN:
            update_joybutton(event->cbutton.button, true);
            break;
        case SDL_CONTROLLERBUTTONUP:
            update_joybutton(event->cbutton.button, false);
            break;
        case SDL_CONTROLLERAXISMOTION:
            update_joyaxis(event->caxis.axis, event->caxis.value);
            break;
        default:
            break;
    }
}